

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::createInstanceWithUnsupportedExtensionsTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  deBool dVar1;
  TestContext *this;
  TestLog *this_00;
  PlatformInterface *platformInterface_00;
  MessageBuilder *pMVar2;
  TestError *this_01;
  allocator<char> local_599;
  string local_598;
  allocator<char> local_571;
  string local_570;
  undefined1 local_550 [8];
  InstanceDriver instanceIface;
  bool gotInstance;
  VkInstance pVStack_3c0;
  VkResult result;
  VkInstance instance;
  int local_238;
  int ndx;
  MessageBuilder local_228;
  undefined4 local_a8 [2];
  VkInstanceCreateInfo instanceCreateInfo;
  VkApplicationInfo appInfo;
  char *enabledExtensions [2];
  PlatformInterface *platformInterface;
  TestLog *log;
  Context *context_local;
  
  this = Context::getTestContext(context);
  this_00 = tcu::TestContext::getLog(this);
  platformInterface_00 = Context::getPlatformInterface(context);
  appInfo._40_8_ = anon_var_dwarf_10d407;
  appInfo._24_8_ = anon_var_dwarf_10d2e1;
  appInfo.pEngineName = (char *)0x40000000000000;
  appInfo.pNext = anon_var_dwarf_10d269;
  appInfo.pApplicationName = (char *)0x0;
  instanceCreateInfo.ppEnabledExtensionNames = (char **)0x0;
  appInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  appInfo._4_4_ = 0;
  local_a8[0] = 1;
  instanceCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  instanceCreateInfo._4_4_ = 0;
  instanceCreateInfo.pNext._0_4_ = 0;
  instanceCreateInfo._16_8_ = &instanceCreateInfo.ppEnabledExtensionNames;
  instanceCreateInfo.pApplicationInfo._0_4_ = 0;
  instanceCreateInfo.enabledLayerCount = 0;
  instanceCreateInfo._36_4_ = 0;
  instanceCreateInfo.ppEnabledLayerNames._0_4_ = 2;
  instanceCreateInfo._48_8_ = &appInfo.engineVersion;
  tcu::TestLog::operator<<(&local_228,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar2 = tcu::MessageBuilder::operator<<(&local_228,(char (*) [25])"Enabled extensions are: ");
  tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_228);
  for (local_238 = 0; local_238 < 2; local_238 = local_238 + 1) {
    tcu::TestLog::operator<<
              ((MessageBuilder *)&instance,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&instance,enabledExtensions + (long)local_238 + -1);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&instance);
  }
  pVStack_3c0 = (VkInstance)0x0;
  instanceIface.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX._4_4_ =
       (**platformInterface_00->_vptr_PlatformInterface)
                 (platformInterface_00,local_a8,0,&stack0xfffffffffffffc40);
  instanceIface.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX._3_1_ =
       pVStack_3c0 != (VkInstance)0x0;
  if (pVStack_3c0 != (VkInstance)0x0) {
    ::vk::InstanceDriver::InstanceDriver
              ((InstanceDriver *)local_550,platformInterface_00,pVStack_3c0);
    ::vk::InstanceDriver::destroyInstance
              ((InstanceDriver *)local_550,pVStack_3c0,(VkAllocationCallbacks *)0x0);
    ::vk::InstanceDriver::~InstanceDriver((InstanceDriver *)local_550);
  }
  if (instanceIface.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX._4_4_ == -7) {
    do {
      dVar1 = ::deGetFalse();
      if ((dVar1 != 0) ||
         ((instanceIface.m_vk.getPhysicalDeviceGeneratedCommandsPropertiesNVX._3_1_ & 1) != 0)) {
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,(char *)0x0,"!gotInstance",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiDeviceInitializationTests.cpp"
                   ,0x15b);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar1 = ::deGetFalse();
    } while (dVar1 != 0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_570,
               "Pass, creating instance with unsupported extension was rejected.",&local_571);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_570);
    std::__cxx11::string::~string((string *)&local_570);
    std::allocator<char>::~allocator(&local_571);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_598,"Fail, creating instance with unsupported extensions succeeded."
               ,&local_599);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_598);
    std::__cxx11::string::~string((string *)&local_598);
    std::allocator<char>::~allocator(&local_599);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createInstanceWithUnsupportedExtensionsTest (Context& context)
{
	tcu::TestLog&						log						= context.getTestContext().getLog();
	const PlatformInterface&			platformInterface		= context.getPlatformInterface();
	const char*							enabledExtensions[]		= {"VK_UNSUPPORTED_EXTENSION", "THIS_IS_NOT_AN_EXTENSION"};
	const VkApplicationInfo				appInfo					=
	{
		VK_STRUCTURE_TYPE_APPLICATION_INFO,						// VkStructureType				sType;
		DE_NULL,												// const void*					pNext;
		"appName",												// const char*					pAppName;
		0u,														// deUint32						appVersion;
		"engineName",											// const char*					pEngineName;
		0u,														// deUint32						engineVersion;
		VK_API_VERSION,											// deUint32						apiVersion;
	};
	const VkInstanceCreateInfo			instanceCreateInfo		=
	{
		VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO,					// VkStructureType				sType;
		DE_NULL,												// const void*					pNext;
		(VkInstanceCreateFlags)0u,								// VkInstanceCreateFlags		flags;
		&appInfo,												// const VkApplicationInfo*		pAppInfo;
		0u,														// deUint32						layerCount;
		DE_NULL,												// const char*const*			ppEnabledLayernames;
		DE_LENGTH_OF_ARRAY(enabledExtensions),					// deUint32						extensionCount;
		enabledExtensions,										// const char*const*			ppEnabledExtensionNames;
	};

	log << TestLog::Message << "Enabled extensions are: " << TestLog::EndMessage;

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(enabledExtensions); ndx++)
		log << TestLog::Message << enabledExtensions[ndx] <<  TestLog::EndMessage;

	{
		VkInstance		instance	= (VkInstance)0;
		const VkResult	result		= platformInterface.createInstance(&instanceCreateInfo, DE_NULL/*pAllocator*/, &instance);
		const bool		gotInstance	= !!instance;

		if (instance)
		{
			const InstanceDriver	instanceIface	(platformInterface, instance);
			instanceIface.destroyInstance(instance, DE_NULL/*pAllocator*/);
		}

		if (result == VK_ERROR_EXTENSION_NOT_PRESENT)
		{
			TCU_CHECK(!gotInstance);
			return tcu::TestStatus::pass("Pass, creating instance with unsupported extension was rejected.");
		}
		else
			return tcu::TestStatus::fail("Fail, creating instance with unsupported extensions succeeded.");
	}
}